

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Ga2_ManDumpStats(Gia_Man_t *pGia,Abs_Par_t *pPars,sat_solver2 *pSat,int iFrame,int fUseN)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  char *pcVar5;
  double dVar6;
  char local_58 [8];
  char pFileName [32];
  FILE *pFile;
  int fUseN_local;
  int iFrame_local;
  sat_solver2 *pSat_local;
  Abs_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  pcVar5 = "";
  if (fUseN != 0) {
    pcVar5 = "n";
  }
  pcVar4 = "";
  if (pPars->fUseFullProof != 0) {
    pcVar4 = "p";
  }
  sprintf(local_58,"stats_gla%s%s.txt",pcVar5,pcVar4);
  __stream = fopen(local_58,"a+");
  pcVar5 = pGia->pName;
  uVar1 = Gia_ManPiNum(pGia);
  uVar2 = Gia_ManRegNum(pGia);
  uVar3 = Gia_ManAndNum(pGia);
  dVar6 = sat_solver2_memory_proof(pSat);
  fprintf(__stream,"%s pi=%d ff=%d and=%d mem=%d bmc=%d",pcVar5,(ulong)uVar1,(ulong)uVar2,
          (ulong)uVar3,(int)(dVar6 / 1048576.0 + 1.0),iFrame);
  if (pGia->vGateClasses != (Vec_Int_t *)0x0) {
    uVar1 = Gia_GlaCountFlops(pGia,pGia->vGateClasses);
    uVar2 = Gia_GlaCountNodes(pGia,pGia->vGateClasses);
    fprintf(__stream," ff=%d and=%d",(ulong)uVar1,(ulong)uVar2);
  }
  fprintf(__stream,"\n");
  fclose(__stream);
  return;
}

Assistant:

void Ga2_ManDumpStats( Gia_Man_t * pGia, Abs_Par_t * pPars, sat_solver2 * pSat, int iFrame, int fUseN )
{
    FILE * pFile;
    char pFileName[32];
    sprintf( pFileName, "stats_gla%s%s.txt", fUseN ? "n":"", pPars->fUseFullProof ? "p":"" ); 

    pFile = fopen( pFileName, "a+" );

    fprintf( pFile, "%s pi=%d ff=%d and=%d mem=%d bmc=%d", 
        pGia->pName, 
        Gia_ManPiNum(pGia), Gia_ManRegNum(pGia), Gia_ManAndNum(pGia), 
        (int)(1 + sat_solver2_memory_proof(pSat)/(1<<20)),
        iFrame );

    if ( pGia->vGateClasses )
    fprintf( pFile, " ff=%d and=%d",                 
        Gia_GlaCountFlops( pGia, pGia->vGateClasses ),
        Gia_GlaCountNodes( pGia, pGia->vGateClasses )  );

    fprintf( pFile, "\n" );
    fclose( pFile );
}